

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

void __thiscall
flatbuffers::JsonPrinter::PrintScalar<double>(JsonPrinter *this,double val,Type *type,int param_3)

{
  EnumDef *this_00;
  size_type sVar1;
  pointer ppEVar2;
  ulong uVar3;
  EnumVal *pEVar4;
  const_iterator cVar5;
  ulong uVar6;
  pointer ppEVar7;
  ulong uVar8;
  bool bVar9;
  key_type local_50;
  
  if (type->base_type == BASE_TYPE_BOOL) {
    std::__cxx11::string::append((char *)this->text);
    return;
  }
  if ((this->opts->output_enum_identifiers == true) &&
     (this_00 = type->enum_def, this_00 != (EnumDef *)0x0)) {
    pEVar4 = EnumDef::ReverseLookup(this_00,(long)val,false);
    if (pEVar4 != (EnumVal *)0x0) {
      std::__cxx11::string::push_back((char)this->text);
      std::__cxx11::string::_M_append((char *)this->text,(ulong)(pEVar4->name)._M_dataplus._M_p);
      std::__cxx11::string::push_back((char)this->text);
      return;
    }
    if ((val != 0.0) || (NAN(val))) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"bit_flags","");
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      *)&(this_00->super_Definition).attributes,&local_50);
      if ((_Rb_tree_header *)cVar5._M_node ==
          &(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
        bVar9 = true;
      }
      else {
        bVar9 = *(long *)(cVar5._M_node + 2) == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (!bVar9) {
        sVar1 = this->text->_M_string_length;
        std::__cxx11::string::push_back((char)this->text);
        ppEVar7 = (this_00->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppEVar2 = (this_00->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppEVar7 != ppEVar2) {
          uVar8 = (long)(val - 9.223372036854776e+18) & (long)val >> 0x3f | (long)val;
          uVar6 = 0;
          do {
            uVar3 = (*ppEVar7)->value;
            if ((uVar3 & uVar8) != 0) {
              uVar6 = uVar6 | uVar3;
              std::__cxx11::string::_M_append
                        ((char *)this->text,(ulong)((*ppEVar7)->name)._M_dataplus._M_p);
              std::__cxx11::string::push_back((char)this->text);
            }
            ppEVar7 = ppEVar7 + 1;
          } while (ppEVar7 != ppEVar2);
          if (uVar6 != 0 && uVar6 == uVar8) {
            (this->text->_M_dataplus)._M_p[this->text->_M_string_length - 1] = '\"';
            return;
          }
        }
        std::__cxx11::string::resize((ulong)this->text,(char)sVar1);
      }
    }
  }
  FloatToString<double>(&local_50,val,0xc);
  std::__cxx11::string::_M_append((char *)this->text,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PrintScalar(T val, const Type &type, int /*indent*/) {
    if (IsBool(type.base_type)) {
      text += val != 0 ? "true" : "false";
      return;  // done
    }

    if (opts.output_enum_identifiers && type.enum_def) {
      const auto &enum_def = *type.enum_def;
      if (auto ev = enum_def.ReverseLookup(static_cast<int64_t>(val))) {
        text += '\"';
        text += ev->name;
        text += '\"';
        return;  // done
      } else if (val && enum_def.attributes.Lookup("bit_flags")) {
        const auto entry_len = text.length();
        const auto u64 = static_cast<uint64_t>(val);
        uint64_t mask = 0;
        text += '\"';
        for (auto it = enum_def.Vals().begin(), e = enum_def.Vals().end();
             it != e; ++it) {
          auto f = (*it)->GetAsUInt64();
          if (f & u64) {
            mask |= f;
            text += (*it)->name;
            text += ' ';
          }
        }
        // Don't slice if (u64 != mask)
        if (mask && (u64 == mask)) {
          text[text.length() - 1] = '\"';
          return;  // done
        }
        text.resize(entry_len);  // restore
      }
      // print as numeric value
    }

    text += NumToString(val);
    return;
  }